

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNodeHandlerTextArea.cpp
# Opt level: O3

bool __thiscall
Rml::XMLNodeHandlerTextArea::ElementData
          (XMLNodeHandlerTextArea *this,XMLParser *parser,String *data,XMLDataType param_3)

{
  ParseFrame *pPVar1;
  long *plVar2;
  SystemInterface *pSVar3;
  String translated_data;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  
  pPVar1 = XMLParser::GetParseFrame(parser);
  if (pPVar1->element != (Element *)0x0) {
    plVar2 = (long *)__dynamic_cast(pPVar1->element,&Element::typeinfo,
                                    &ElementFormControlTextArea::typeinfo,0);
    if (plVar2 != (long *)0x0) {
      local_30 = 0;
      local_28 = 0;
      local_38 = &local_28;
      pSVar3 = GetSystemInterface();
      (*pSVar3->_vptr_SystemInterface[3])(pSVar3,&local_38,data);
      (**(code **)(*plVar2 + 200))(plVar2,&local_38);
      if (local_38 != &local_28) {
        operator_delete(local_38,CONCAT71(uStack_27,local_28) + 1);
      }
    }
  }
  return true;
}

Assistant:

bool XMLNodeHandlerTextArea::ElementData(XMLParser* parser, const String& data, XMLDataType /*type*/)
{
	ElementFormControlTextArea* text_area = rmlui_dynamic_cast<ElementFormControlTextArea*>(parser->GetParseFrame()->element);
	if (text_area != nullptr)
	{
		// Do any necessary translation.
		String translated_data;
		GetSystemInterface()->TranslateString(translated_data, data);

		text_area->SetValue(translated_data);
	}

	return true;
}